

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionResultBuilder::ExprComponents::~ExprComponents(ExprComponents *this)

{
  ExprComponents *this_local;
  
  std::__cxx11::string::~string((string *)&this->op);
  std::__cxx11::string::~string((string *)&this->rhs);
  std::__cxx11::string::~string((string *)&this->lhs);
  return;
}

Assistant:

ExprComponents() : shouldNegate( false ) {}